

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphpsll(fitsfile *fptr,int bitpix,int naxis,LONGLONG *naxes,int *status)

{
  int *in_R8;
  int extend;
  LONGLONG gcount;
  LONGLONG pcount;
  int simple;
  LONGLONG in_stack_000001b8;
  LONGLONG *in_stack_000001c0;
  int in_stack_000001cc;
  int in_stack_000001d0;
  int in_stack_000001d4;
  fitsfile *in_stack_000001d8;
  LONGLONG in_stack_000001f0;
  int in_stack_000001f8;
  int *in_stack_00000200;
  
  ffphprll(in_stack_000001d8,in_stack_000001d4,in_stack_000001d0,in_stack_000001cc,in_stack_000001c0
           ,in_stack_000001b8,in_stack_000001f0,in_stack_000001f8,in_stack_00000200);
  return *in_R8;
}

Assistant:

int ffphpsll( fitsfile *fptr, /* I - FITS file pointer                        */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            LONGLONG naxes[],   /* I - length of each data axis                 */
            int *status)    /* IO - error status                            */
/*
  write STANDARD set of required primary header keywords
*/
{
    int simple = 1;     /* does file conform to FITS standard? 1/0  */
    LONGLONG pcount = 0;    /* number of group parameters (usually 0)   */
    LONGLONG gcount = 1;    /* number of random groups (usually 1 or 0) */
    int extend = 1;     /* may FITS file have extensions?           */

    ffphprll(fptr, simple, bitpix, naxis, naxes, pcount, gcount, extend, status);
    return(*status);
}